

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O3

string * __thiscall
cmCPackIFWGenerator::GetComponentPackageName_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this,cmCPackComponent *component)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  cmCPackComponentGroup *pcVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  int iVar7;
  _Base_ptr p_Var8;
  long *plVar9;
  char *__s;
  size_t sVar10;
  _Base_ptr p_Var11;
  size_type *psVar12;
  long *plVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string prefix;
  string local_b0;
  _Alloc_hider local_90;
  size_type local_88;
  char local_80;
  undefined7 uStack_7f;
  undefined1 uStack_78;
  undefined4 uStack_77;
  undefined2 uStack_73;
  char cStack_71;
  string local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_90._M_p = &local_80;
  local_88 = 0;
  local_80 = '\0';
  if (component == (cmCPackComponent *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 1) = CONCAT17(uStack_78,uStack_7f);
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 9) = uStack_77;
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 0xd) = uStack_73;
    (__return_storage_ptr__->field_2)._M_local_buf[0xf] = cStack_71;
    __return_storage_ptr__->_M_string_length = 0;
    local_80 = '\0';
    goto LAB_0024e79d;
  }
  p_Var11 = (this->ComponentPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var11 != (_Base_ptr)0x0) {
    p_Var1 = &(this->ComponentPackages)._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var1->_M_header;
    do {
      if (*(cmCPackComponent **)(p_Var11 + 1) >= component) {
        p_Var8 = p_Var11;
      }
      p_Var11 = (&p_Var11->_M_left)[*(cmCPackComponent **)(p_Var11 + 1) < component];
    } while (p_Var11 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var8 != p_Var1) && (*(cmCPackComponent **)(p_Var8 + 1) <= component))
       && (p_Var11 = p_Var8[1]._M_parent, p_Var11 != (_Base_ptr)0x0)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,*(long *)(p_Var11 + 4),
                 (long)&(p_Var11[4]._M_parent)->_M_color + *(long *)(p_Var11 + 4));
      goto LAB_0024e79d;
    }
  }
  cmsys::SystemTools::UpperCase(&local_70,&component->Name);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x4eb022);
  paVar2 = &local_b0.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_b0.field_2._M_allocated_capacity = *psVar12;
    local_b0.field_2._8_8_ = plVar9[3];
    local_b0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar12;
    local_b0._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_b0._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_50 = &local_40;
  plVar13 = plVar9 + 2;
  if ((long *)*plVar9 == plVar13) {
    local_40 = *plVar13;
    lStack_38 = plVar9[3];
  }
  else {
    local_40 = *plVar13;
    local_50 = (long *)*plVar9;
  }
  local_48 = plVar9[1];
  *plVar9 = (long)plVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_50,local_48 + (long)local_50);
  std::__cxx11::string::append((char *)&local_b0);
  __s = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (__s == (char *)0x0) {
    pcVar3 = (component->Name)._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar3,pcVar3 + (component->Name)._M_string_length);
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    sVar10 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,__s,__s + sVar10);
  }
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = component->Group;
  if (pcVar4 == (cmCPackComponentGroup *)0x0) {
LAB_0024e739:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_90._M_p == &local_80) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_7f,local_80);
      *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
           CONCAT17(cStack_71,CONCAT25(uStack_73,CONCAT41(uStack_77,uStack_78)));
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_90._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_7f,local_80);
    }
    __return_storage_ptr__->_M_string_length = local_88;
    local_88 = 0;
    local_80 = '\0';
    local_90._M_p = &local_80;
  }
  else {
    p_Var11 = (this->GroupPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var11 == (_Base_ptr)0x0) {
LAB_0024e557:
      p_Var11 = (_Base_ptr)0x0;
    }
    else {
      p_Var1 = &(this->GroupPackages)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = &p_Var1->_M_header;
      do {
        if (*(cmCPackComponentGroup **)(p_Var11 + 1) >= pcVar4) {
          p_Var8 = p_Var11;
        }
        p_Var11 = (&p_Var11->_M_left)[*(cmCPackComponentGroup **)(p_Var11 + 1) < pcVar4];
      } while (p_Var11 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var8 == p_Var1) ||
         (pcVar4 < *(cmCPackComponentGroup **)(p_Var8 + 1))) goto LAB_0024e557;
      p_Var11 = p_Var8[1]._M_parent;
    }
    if ((this->super_cmCPackGenerator).componentPackageMethod != ONE_PACKAGE_PER_GROUP) {
      local_b0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_50,local_48 + (long)local_50);
      std::__cxx11::string::append((char *)&local_b0);
      bVar6 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar6) {
        if (this->ResolveDuplicateNames == false) {
          std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_90);
          _Var5._M_p = local_b0._M_dataplus._M_p;
          if ((_Base_ptr)local_b0._M_string_length == p_Var11[4]._M_parent) {
            if ((_Base_ptr)local_b0._M_string_length == (_Base_ptr)0x0) {
              bVar6 = true;
            }
            else {
              iVar7 = bcmp(local_b0._M_dataplus._M_p,*(void **)(p_Var11 + 4),
                           local_b0._M_string_length);
              bVar6 = iVar7 == 0;
            }
          }
          else {
            bVar6 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var5._M_p != paVar2) {
            operator_delete(_Var5._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if (!bVar6) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,*(long *)(p_Var11 + 4),
                       (long)&(p_Var11[4]._M_parent)->_M_color + *(long *)(p_Var11 + 4));
            std::__cxx11::string::append((char *)&local_70);
            plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_p)
            ;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_b0.field_2._M_allocated_capacity = *psVar12;
              local_b0.field_2._8_8_ = plVar9[3];
              local_b0._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar12;
              local_b0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_b0._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != paVar2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
        }
        goto LAB_0024e739;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(p_Var11 + 4),
               (long)&(p_Var11[4]._M_parent)->_M_color + *(long *)(p_Var11 + 4));
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
LAB_0024e79d:
  if (local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,CONCAT71(uStack_7f,local_80) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWGenerator::GetComponentPackageName(
  cmCPackComponent *component) const
{
  std::string name;
  if (!component) return name;
  if (cmCPackIFWPackage* package = GetComponentPackage(component))
    {
    return package->Name;
    }
  std::string prefix = "CPACK_IFW_COMPONENT_"
    + cmsys::SystemTools::UpperCase(component->Name)
    + "_";
  const char* option = GetOption(prefix + "NAME");
  name = option ? option : component->Name;
  if(component->Group)
    {
    cmCPackIFWPackage* package = GetGroupPackage(component->Group);
    if((componentPackageMethod == ONE_PACKAGE_PER_GROUP)
       || IsOn(prefix + "COMMON"))
      {
      return package->Name;
      }
    bool dot = !ResolveDuplicateNames;
    if(dot && name.substr(0, package->Name.size()) == package->Name)
      {
      dot = false;
      }
    if(dot)
      {
      name = package->Name + "." + name;
      }
    }
  return name;
}